

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O2

OperatorResultType
ThrottlingSum::Function
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  LocalTableFunctionState *pLVar1;
  DataChunk *pDVar2;
  char cVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  idx_t i;
  Value *pVVar7;
  ulong uVar8;
  ulong __n;
  Value *pVVar9;
  int sum;
  LocalTableFunctionState *local_90;
  LocalTableFunctionState *local_88;
  DataChunk *local_80;
  ExecutionContext *local_78;
  LogicalType local_70 [64];
  
  local_80 = output;
  local_78 = context;
  local_88 = duckdb::optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
                       ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)(data_p + 8));
  local_90 = local_88 + 8;
  for (uVar8 = 0; uVar8 < *(ulong *)(input + 0x18); uVar8 = uVar8 + 1) {
    sum = 0;
    for (__n = 0; __n < (ulong)((*(long *)(input + 8) - *(long *)input) / 0x68); __n = __n + 1) {
      pvVar5 = duckdb::vector<duckdb::Vector,_true>::get<true>
                         ((vector<duckdb::Vector,_true> *)input,__n);
      duckdb::LogicalType::LogicalType(local_70,INTEGER);
      cVar3 = duckdb::LogicalType::operator==((LogicalType *)(pvVar5 + 8),local_70);
      duckdb::LogicalType::~LogicalType(local_70);
      if (cVar3 != '\0') {
        duckdb::vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,__n);
        duckdb::Vector::GetValue((ulong)local_70);
        iVar4 = duckdb::Value::GetValue<int>();
        sum = sum + iVar4;
        duckdb::Value::~Value((Value *)local_70);
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_90,&sum);
  }
  cVar3 = duckdb::PhysicalOperator::OperatorCachingAllowed(local_78);
  pDVar2 = local_80;
  pLVar1 = local_88;
  if (cVar3 == '\0') {
    pVVar9 = (Value *)((*(long *)(local_88 + 0x10) - *(long *)(local_88 + 8) >> 2) -
                      *(long *)(local_88 + 0x20));
    for (pVVar7 = (Value *)0x0; pVVar9 != pVVar7; pVVar7 = pVVar7 + 1) {
      pvVar6 = duckdb::vector<int,_true>::get<true>
                         ((vector<int,_true> *)local_90,
                          (size_type)(pVVar7 + *(long *)(pLVar1 + 0x20)));
      duckdb::Value::Value((Value *)local_70,*pvVar6);
      duckdb::DataChunk::SetValue((ulong)pDVar2,0,pVVar7);
      duckdb::Value::~Value((Value *)local_70);
    }
    pLVar1 = pLVar1 + 0x20;
    *(Value **)pLVar1 = pVVar9 + *(long *)pLVar1;
    *(Value **)(pDVar2 + 0x18) = pVVar9;
  }
  else {
    uVar8 = *(ulong *)(local_88 + 0x20);
    if (uVar8 < (ulong)(*(long *)(local_88 + 0x10) - *(long *)(local_88 + 8) >> 2)) {
      *(undefined8 *)(local_80 + 0x18) = 1;
      *(ulong *)(local_88 + 0x20) = uVar8 + 1;
      pvVar6 = duckdb::vector<int,_true>::get<true>((vector<int,_true> *)local_90,uVar8);
      duckdb::Value::Value((Value *)local_70,*pvVar6);
      duckdb::DataChunk::SetValue((ulong)pDVar2,0,(Value *)0x0);
      duckdb::Value::~Value((Value *)local_70);
    }
    else {
      *(undefined8 *)(local_80 + 0x18) = 0;
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

static OperatorResultType Function(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
	                                   DataChunk &output) {
		auto &local_state = data_p.local_state->Cast<ThrottlingSum::ThrottlingSumLocalData>();

		for (idx_t row_idx = 0; row_idx < input.size(); row_idx++) {
			int sum = 0;
			for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
				if (input.data[col_idx].GetType() == LogicalType::INTEGER) {
					sum += input.data[col_idx].GetValue(row_idx).GetValue<int>();
				}
			}
			local_state.row_sums.push_back(sum);
		}

		if (PhysicalOperator::OperatorCachingAllowed(context)) {
			// Caching is allowed
			if (local_state.current_idx < local_state.row_sums.size()) {
				output.SetCardinality(1);
				output.SetValue(0, 0, Value(local_state.row_sums[local_state.current_idx++]));
			} else {
				output.SetCardinality(0);
			}
		} else {
			// Caching is not allowed, we should emit everything!
			auto to_emit = local_state.row_sums.size() - local_state.current_idx;
			for (idx_t i = 0; i < to_emit; i++) {
				output.SetValue(0, i, Value(local_state.row_sums[local_state.current_idx + i]));
			}
			local_state.current_idx += to_emit;
			output.SetCardinality(to_emit);
		}

		return OperatorResultType::NEED_MORE_INPUT;
	}